

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O1

bool __thiscall catalog::newTable(catalog *this,TableInfo *tableInfo)

{
  long *plVar1;
  ofstream tablelist;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  this->tableNumber = this->tableNumber + 1;
  if (this->anychangeornot == false) {
    this->anychangeornot = true;
  }
  std::ofstream::ofstream(&local_220,"./file/catalog/table.dat",_S_out|_S_in|_S_bin);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"current table number : ",0x17);
  plVar1 = (long *)std::ostream::operator<<(&std::cout,this->tableNumber);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::ostream::write((char *)&local_220,(long)&this->tableNumber);
  writeTabletoFile(this,tableInfo,(ofstream *)&local_220);
  std::ofstream::close();
  addInfoToList(this,tableInfo);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"create table successfully!",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return true;
}

Assistant:

bool catalog::newTable(TableInfo* tableInfo){
    tableNumber++; 
    if(anychangeornot == false)anychangeornot = true;
    std::ofstream tablelist("./file/catalog/table.dat", std::ios::out | std::ios::binary | std::ios::in);
    std::cout<<"current table number : "<<tableNumber<<std::endl;
    //增加文件中标明的table数目
    tablelist.write(reinterpret_cast<char*>(&tableNumber), sizeof(int));
    writeTabletoFile(tableInfo,tablelist);
    tablelist.close();
    addInfoToList(tableInfo);
    std::cout<<"create table successfully!"<<std::endl;
    return true;
}